

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

AddressFactory * __thiscall
cfd::AddressFactory::CreateTaprootAddress
          (AddressFactory *this,TaprootScriptTree *tree,SchnorrPubkey *internal_pubkey)

{
  SchnorrPubkey pk;
  void *local_30 [3];
  
  cfd::core::TapBranch::GetTweakedPubkey((SchnorrPubkey *)local_30,(bool *)internal_pubkey);
  cfd::core::Address::Address
            ((Address *)this,*(NetType *)(tree + 8),kVersion1,(SchnorrPubkey *)local_30,
             (vector *)(tree + 0x10));
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0]);
  }
  return this;
}

Assistant:

Address AddressFactory::CreateTaprootAddress(
    const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey) const {
  auto pk = tree.GetTweakedPubkey(internal_pubkey);
  return CreateTaprootAddress(pk);
}